

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor___decorate_internal_int__
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DObject *this;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this = (DObject *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this != (DObject *)0x0) {
          bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
          if (!bVar1) {
            pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_003d879f;
          }
        }
LAB_003d875b:
        if (numparam == 1) {
          pcVar3 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\0') {
            if (numret < 1) {
              iVar2 = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x2ec,
                              "int AF_AActor___decorate_internal_int__(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetInt(ret,param[1].field_0.i);
              iVar2 = 1;
            }
            return iVar2;
          }
          pcVar3 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x2eb,
                      "int AF_AActor___decorate_internal_int__(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (this == (DObject *)0x0) goto LAB_003d875b;
    }
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d879f:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x2ea,
                "int AF_AActor___decorate_internal_int__(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, __decorate_internal_int__)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(returnme);
	ACTION_RETURN_INT(returnme);
}